

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

void leveldb::PutVarint64(string *dst,uint64_t v)

{
  bool bVar1;
  uint64_t uVar2;
  byte *pbVar3;
  char buf [10];
  byte local_a [10];
  
  pbVar3 = local_a;
  if (0x7f < v) {
    pbVar3 = local_a;
    uVar2 = v;
    do {
      *pbVar3 = (byte)uVar2 | 0x80;
      pbVar3 = pbVar3 + 1;
      v = uVar2 >> 7;
      bVar1 = 0x3fff < uVar2;
      uVar2 = v;
    } while (bVar1);
  }
  *pbVar3 = (byte)v;
  std::__cxx11::string::append((char *)dst,(ulong)local_a);
  return;
}

Assistant:

void PutVarint64(std::string* dst, uint64_t v) {
  char buf[10];
  char* ptr = EncodeVarint64(buf, v);
  dst->append(buf, ptr - buf);
}